

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addImportThrowingSupport(TranslateToFuzzReader *this)

{
  Module *module;
  char *pcVar1;
  Expression *pEVar2;
  string_view sVar3;
  string_view local_48;
  Name local_38;
  _Head_base<0UL,_wasm::Function_*,_false> local_28;
  __single_object func;
  
  module = this->wasm;
  Name::Name((Name *)&local_48,"throw");
  sVar3 = (string_view)Names::getValidFunctionName(module,(Name)local_48);
  (this->throwImportName).super_IString.str = sVar3;
  std::make_unique<wasm::Function>();
  pcVar1 = (this->throwImportName).super_IString.str._M_str;
  ((local_28._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
       (this->throwImportName).super_IString.str._M_len;
  ((local_28._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = pcVar1;
  if (this->preserveImportsAndExports == false) {
    Name::Name(&local_38,"fuzzing-support");
    ((local_28._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         local_38.super_IString.str._M_len;
    ((local_28._M_head_impl)->super_Importable).module.super_IString.str._M_str =
         local_38.super_IString.str._M_str;
    Name::Name(&local_38,"throw");
    ((local_28._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         local_38.super_IString.str._M_len;
    ((local_28._M_head_impl)->super_Importable).base.super_IString.str._M_str =
         local_38.super_IString.str._M_str;
  }
  else {
    pEVar2 = (Expression *)Builder::makeNop(&this->builder);
    (local_28._M_head_impl)->body = pEVar2;
  }
  wasm::HeapType::HeapType((HeapType *)&local_38,(Signature)ZEXT816(2));
  ((local_28._M_head_impl)->type).id = local_38.super_IString.str._M_len;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_28);
  return;
}

Assistant:

void TranslateToFuzzReader::addImportThrowingSupport() {
  // Throw some kind of exception from JS. If we send 0 then a pure JS
  // exception is thrown, and any other value is the value in a wasm tag.
  throwImportName = Names::getValidFunctionName(wasm, "throw");
  auto func = std::make_unique<Function>();
  func->name = throwImportName;
  if (!preserveImportsAndExports) {
    func->module = "fuzzing-support";
    func->base = "throw";
  } else {
    // As with logging, implement in a trivial way when we cannot add imports.
    func->body = builder.makeNop();
  }
  func->type = Signature(Type::i32, Type::none);
  wasm.addFunction(std::move(func));
}